

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O0

wchar_t mb_to_wc(wchar_t codepage,wchar_t flags,char *mbstr,wchar_t mblen,wchar_t *wcstr,
                wchar_t wclen)

{
  size_t sVar1;
  wchar_t local_4c;
  wchar_t n_1;
  size_t i;
  mbstate_t state;
  wchar_t n;
  wchar_t wclen_local;
  wchar_t *wcstr_local;
  byte *pbStack_20;
  wchar_t mblen_local;
  char *mbstr_local;
  wchar_t local_10;
  wchar_t flags_local;
  wchar_t codepage_local;
  
  state.__value = (anon_union_4_2_91654ee9_for___value)wclen;
  wcstr_local._4_4_ = mblen;
  pbStack_20 = (byte *)mbstr;
  mbstr_local._4_4_ = flags;
  local_10 = codepage;
  if (codepage == L'\xffff') {
    state.__count = L'\0';
    memset(&i,0,8);
    for (; L'\0' < wcstr_local._4_4_; wcstr_local._4_4_ = wcstr_local._4_4_ - (int)sVar1) {
      if ((int)state.__value.__wch <= state.__count) {
        return state.__count;
      }
      sVar1 = mbrtowc(wcstr + state.__count,(char *)pbStack_20,(long)wcstr_local._4_4_,
                      (mbstate_t *)&i);
      if ((sVar1 == 0xffffffffffffffff) || (sVar1 == 0xfffffffffffffffe)) break;
      state.__count = state.__count + L'\x01';
      pbStack_20 = (byte *)((char *)pbStack_20 + sVar1);
    }
    flags_local = state.__count;
  }
  else if (codepage == L'\0') {
    local_4c = L'\0';
    for (; L'\0' < wcstr_local._4_4_; wcstr_local._4_4_ = wcstr_local._4_4_ + L'\xffffffff') {
      if (wclen <= local_4c) {
        return local_4c;
      }
      wcstr[local_4c] = *pbStack_20 | 0xd800;
      local_4c = local_4c + L'\x01';
      pbStack_20 = pbStack_20 + 1;
    }
    flags_local = local_4c;
  }
  else {
    flags_local = charset_to_unicode((char **)&stack0xffffffffffffffe0,
                                     (wchar_t *)((long)&wcstr_local + 4),wcstr,wclen,codepage,
                                     (charset_state *)0x0,(wchar_t *)0x0,L'\0');
  }
  return flags_local;
}

Assistant:

int mb_to_wc(int codepage, int flags, const char *mbstr, int mblen,
             wchar_t *wcstr, int wclen)
{
    if (codepage == DEFAULT_CODEPAGE) {
        int n = 0;
        mbstate_t state;

        memset(&state, 0, sizeof state);

        while (mblen > 0) {
            if (n >= wclen)
                return n;
            size_t i = mbrtowc(wcstr+n, mbstr, (size_t)mblen, &state);
            if (i == (size_t)-1 || i == (size_t)-2)
                break;
            n++;
            mbstr += i;
            mblen -= i;
        }

        return n;
    } else if (codepage == CS_NONE) {
        int n = 0;

        while (mblen > 0) {
            if (n >= wclen)
                return n;
            wcstr[n] = 0xD800 | (mbstr[0] & 0xFF);
            n++;
            mbstr++;
            mblen--;
        }

        return n;
    } else
        return charset_to_unicode(&mbstr, &mblen, wcstr, wclen, codepage,
                                  NULL, NULL, 0);
}